

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall
VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>::typed_option
          (typed_option<std::vector<char,_std::allocator<char>_>_> *this,
          typed_option<std::vector<char,_std::allocator<char>_>_> *param_2)

{
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *in_RSI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *in_RDI;
  
  config::base_option::base_option(&this->super_base_option,&param_2->super_base_option);
  (in_RDI->super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>)
  ._M_ptr = (element_type *)&PTR__typed_option_0052c998;
  in_RDI[7].super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       in_RSI[7].
       super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::shared_ptr(in_RSI,in_RDI);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::shared_ptr(in_RSI,in_RDI);
  return;
}

Assistant:

typed_option(const std::string& name, T& location) : base_option(name, typeid(T).hash_code()), m_location{location} {}